

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O1

size_t __thiscall
benchmark::internal::BenchmarkFamilies::AddBenchmark
          (BenchmarkFamilies *this,
          unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
          *family)

{
  pointer puVar1;
  pointer puVar2;
  MutexLock l;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = &(this->mutex_).mut_;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  puVar1 = (this->families_).
           super__Vector_base<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->families_).
           super__Vector_base<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::
  vector<std::unique_ptr<benchmark::internal::Benchmark,std::default_delete<benchmark::internal::Benchmark>>,std::allocator<std::unique_ptr<benchmark::internal::Benchmark,std::default_delete<benchmark::internal::Benchmark>>>>
  ::
  emplace_back<std::unique_ptr<benchmark::internal::Benchmark,std::default_delete<benchmark::internal::Benchmark>>>
            ((vector<std::unique_ptr<benchmark::internal::Benchmark,std::default_delete<benchmark::internal::Benchmark>>,std::allocator<std::unique_ptr<benchmark::internal::Benchmark,std::default_delete<benchmark::internal::Benchmark>>>>
              *)this,family);
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return (long)puVar2 - (long)puVar1 >> 3;
}

Assistant:

size_t BenchmarkFamilies::AddBenchmark(std::unique_ptr<Benchmark> family) {
  MutexLock l(mutex_);
  size_t index = families_.size();
  families_.push_back(std::move(family));
  return index;
}